

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  unsigned_long_long uVar9;
  double dVar10;
  int iVar11;
  GetterYs<unsigned_long_long> *pGVar12;
  TransformerLinLog *pTVar13;
  ImPlotPlot *pIVar14;
  GetterYRef *pGVar15;
  ImDrawVert *pIVar16;
  ImDrawIdx *pIVar17;
  double dVar18;
  double dVar19;
  ImVec2 IVar20;
  ushort uVar21;
  ImPlotContext *pIVar22;
  ImPlotContext *pIVar23;
  bool bVar24;
  ImDrawIdx IVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  ImVec2 IVar29;
  float fVar30;
  ImVec2 IVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  
  pIVar22 = GImPlot;
  pGVar12 = this->Getter1;
  dVar18 = (double)(prim + 1);
  dVar7 = pGVar12->XScale;
  dVar8 = pGVar12->X0;
  pTVar13 = this->Transformer;
  iVar11 = pGVar12->Count;
  uVar9 = *(unsigned_long_long *)
           ((long)pGVar12->Ys +
           (long)(((prim + 1 + pGVar12->Offset) % iVar11 + iVar11) % iVar11) * (long)pGVar12->Stride
           );
  dVar19 = log10((((double)CONCAT44(0x45300000,(int)(uVar9 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[pTVar13->YAxis].Range.Min);
  pIVar23 = GImPlot;
  iVar11 = pTVar13->YAxis;
  pIVar14 = pIVar22->CurrentPlot;
  dVar10 = pIVar14->YAxis[iVar11].Range.Min;
  fVar28 = (float)(((dVar7 * dVar18 + dVar8) - (pIVar14->XAxis).Range.Min) * pIVar22->Mx +
                  (double)pIVar22->PixelRange[iVar11].Min.x);
  fVar27 = (float)((((double)(float)(dVar19 / pIVar22->LogDenY[iVar11]) *
                     (pIVar14->YAxis[iVar11].Range.Max - dVar10) + dVar10) - dVar10) *
                   pIVar22->My[iVar11] + (double)pIVar22->PixelRange[iVar11].Min.y);
  pGVar15 = this->Getter2;
  dVar7 = pGVar15->XScale;
  dVar8 = pGVar15->X0;
  pTVar13 = this->Transformer;
  dVar19 = log10(pGVar15->YRef / GImPlot->CurrentPlot->YAxis[pTVar13->YAxis].Range.Min);
  iVar11 = pTVar13->YAxis;
  pIVar14 = pIVar23->CurrentPlot;
  dVar10 = pIVar14->YAxis[iVar11].Range.Min;
  fVar32 = (float)(((dVar18 * dVar7 + dVar8) - (pIVar14->XAxis).Range.Min) * pIVar23->Mx +
                  (double)pIVar23->PixelRange[iVar11].Min.x);
  fVar34 = (float)((((double)(float)(dVar19 / pIVar23->LogDenY[iVar11]) *
                     (pIVar14->YAxis[iVar11].Range.Max - dVar10) + dVar10) - dVar10) *
                   pIVar23->My[iVar11] + (double)pIVar23->PixelRange[iVar11].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar30 = fVar3;
  if (fVar5 <= fVar3) {
    fVar30 = fVar5;
  }
  if (fVar27 <= fVar30) {
    fVar30 = fVar27;
  }
  if (fVar34 <= fVar30) {
    fVar30 = fVar34;
  }
  bVar24 = false;
  if ((fVar30 < (cull_rect->Max).y) &&
     (fVar30 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar26 = -(uint)(fVar27 <= fVar30),
     fVar30 = (float)(~uVar26 & (uint)fVar27 | uVar26 & (uint)fVar30),
     uVar26 = -(uint)(fVar34 <= fVar30),
     fVar30 = (float)(~uVar26 & (uint)fVar34 | uVar26 & (uint)fVar30), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar30 && fVar30 != *pfVar1)) {
    fVar30 = fVar2;
    if (fVar4 <= fVar2) {
      fVar30 = fVar4;
    }
    if (fVar28 <= fVar30) {
      fVar30 = fVar28;
    }
    if (fVar32 <= fVar30) {
      fVar30 = fVar32;
    }
    bVar24 = false;
    if (fVar30 < (cull_rect->Max).x) {
      fVar30 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar26 = -(uint)(fVar28 <= fVar30);
      fVar30 = (float)(~uVar26 & (uint)fVar28 | uVar26 & (uint)fVar30);
      uVar26 = -(uint)(fVar32 <= fVar30);
      fVar30 = (float)(~uVar26 & (uint)fVar32 | uVar26 & (uint)fVar30);
      bVar24 = (cull_rect->Min).x <= fVar30 && fVar30 != (cull_rect->Min).x;
    }
  }
  IVar29.y = fVar27;
  IVar29.x = fVar28;
  IVar31.y = fVar34;
  IVar31.x = fVar32;
  if (bVar24 != false) {
    fVar30 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar36 = fVar2 * fVar27 - fVar28 * fVar3;
    fVar35 = fVar4 * fVar34 - fVar32 * fVar5;
    fVar33 = (fVar2 - fVar28) * (fVar5 - fVar34) - (fVar4 - fVar32) * (fVar3 - fVar27);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16->col = this->Col;
    pIVar16[1].pos = IVar29;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[1].col = this->Col;
    IVar20.y = ((fVar5 - fVar34) * fVar36 - (fVar3 - fVar27) * fVar35) / fVar33;
    IVar20.x = (fVar36 * (fVar4 - fVar32) - (fVar2 - fVar28) * fVar35) / fVar33;
    pIVar16[2].pos = IVar20;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[2].col = this->Col;
    pIVar16[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[3].col = this->Col;
    pIVar16[4].pos = IVar31;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar16 + 5;
    uVar26 = DrawList->_VtxCurrentIdx;
    pIVar17 = DrawList->_IdxWritePtr;
    IVar25 = (ImDrawIdx)uVar26;
    *pIVar17 = IVar25;
    uVar21 = -(ushort)(fVar6 < fVar30 && fVar27 < fVar34 || fVar30 < fVar6 && fVar34 < fVar27) & 1;
    pIVar17[1] = IVar25 + uVar21 + 1;
    pIVar17[2] = IVar25 + 3;
    pIVar17[3] = IVar25 + 1;
    pIVar17[4] = (uVar21 ^ 3) + IVar25;
    pIVar17[5] = IVar25 + 4;
    DrawList->_IdxWritePtr = pIVar17 + 6;
    DrawList->_VtxCurrentIdx = uVar26 + 5;
  }
  this->P11 = IVar29;
  this->P12 = IVar31;
  return bVar24;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }